

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

void __thiscall
SQFuncState::SetInstructionParam(SQFuncState *this,SQInteger pos,SQInteger arg,SQInteger val)

{
  uchar uVar1;
  
  uVar1 = (uchar)val;
  switch(arg) {
  case 0:
    (this->_instructions)._vals[pos]._arg0 = uVar1;
    break;
  case 1:
  case 4:
    (this->_instructions)._vals[pos]._arg1 = (SQInt32)val;
    return;
  case 2:
    (this->_instructions)._vals[pos]._arg2 = uVar1;
    return;
  case 3:
    (this->_instructions)._vals[pos]._arg3 = uVar1;
    return;
  }
  return;
}

Assistant:

void SQFuncState::SetInstructionParam(SQInteger pos,SQInteger arg,SQInteger val)
{
    switch(arg){
        case 0:_instructions[pos]._arg0=(unsigned char)*((SQUnsignedInteger *)&val);break;
        case 1:case 4:_instructions[pos]._arg1=(SQInt32)*((SQUnsignedInteger *)&val);break;
        case 2:_instructions[pos]._arg2=(unsigned char)*((SQUnsignedInteger *)&val);break;
        case 3:_instructions[pos]._arg3=(unsigned char)*((SQUnsignedInteger *)&val);break;
    };
}